

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  char *pcVar1;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  undefined8 *puVar2;
  uint uVar3;
  CommentInfo *local_50;
  CommentInfo *otherComment;
  int comment;
  Value *other_local;
  Value *this_local;
  
  this->field_0x8 = other->field_0x8;
  this->field_0x9 = this->field_0x9 & 0xfe;
  this->comments_ = (CommentInfo *)0x0;
  uVar3 = (uint)(ushort)(byte)this->field_0x8;
  if (3 < (byte)this->field_0x8) {
    if (uVar3 == 4) {
      if ((other->value_).int_ == 0) {
        (this->value_).int_ = 0;
      }
      else {
        pcVar1 = duplicateStringValue((other->value_).string_,0xffffffff);
        (this->value_).string_ = pcVar1;
        *(ushort *)&this->field_0x8 = *(ushort *)&this->field_0x8 & 0xfeff | 0x100;
      }
      goto LAB_001776f2;
    }
    if (uVar3 != 5) {
      if (1 < uVar3 - 6) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                      ,0x1e9,"Json::Value::Value(const Value &)");
      }
      this_00 = (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                 *)operator_new(0x30);
      std::
      map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::map(this_00,(other->value_).map_);
      (this->value_).map_ = this_00;
      goto LAB_001776f2;
    }
  }
  this->value_ = other->value_;
LAB_001776f2:
  if (other->comments_ != (CommentInfo *)0x0) {
    puVar2 = (undefined8 *)operator_new__(0x20);
    *puVar2 = 3;
    local_50 = (CommentInfo *)(puVar2 + 1);
    do {
      CommentInfo::CommentInfo(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != (CommentInfo *)(puVar2 + 4));
    this->comments_ = (CommentInfo *)(puVar2 + 1);
    for (otherComment._0_4_ = 0; (int)otherComment < 3; otherComment._0_4_ = (int)otherComment + 1)
    {
      if (other->comments_[(int)otherComment].comment_ != (char *)0x0) {
        CommentInfo::setComment
                  (this->comments_ + (int)otherComment,other->comments_[(int)otherComment].comment_)
        ;
      }
    }
  }
  return;
}

Assistant:

Value::Value( const Value &other )
   : type_( other.type_ )
   , allocated_( false )
# ifdef JSON_VALUE_USE_INTERNAL_MAP
   , itemIsUsed_( 0 )
#endif
   , comments_( 0 )
{
   switch ( type_ )
   {
   case nullValue:
   case intValue:
   case uintValue:
   case realValue:
   case booleanValue:
      value_ = other.value_;
      break;
   case stringValue:
      if ( other.value_.string_ )
      {
         value_.string_ = duplicateStringValue( other.value_.string_ );
         allocated_ = true;
      }
      else
         value_.string_ = 0;
      break;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   case arrayValue:
   case objectValue:
      value_.map_ = new ObjectValues( *other.value_.map_ );
      break;
#else
   case arrayValue:
      value_.array_ = arrayAllocator()->newArrayCopy( *other.value_.array_ );
      break;
   case objectValue:
      value_.map_ = mapAllocator()->newMapCopy( *other.value_.map_ );
      break;
#endif
   default:
      JSON_ASSERT_UNREACHABLE;
   }
   if ( other.comments_ )
   {
      comments_ = new CommentInfo[numberOfCommentPlacement];
      for ( int comment =0; comment < numberOfCommentPlacement; ++comment )
      {
         const CommentInfo &otherComment = other.comments_[comment];
         if ( otherComment.comment_ )
            comments_[comment].setComment( otherComment.comment_ );
      }
   }
}